

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void walIndexClose(Wal *pWal,int isDelete)

{
  int i;
  long lVar1;
  
  if ((pWal->exclusiveMode == '\x02') || (pWal->bShmUnreliable != '\0')) {
    for (lVar1 = 0; lVar1 < pWal->nWiData; lVar1 = lVar1 + 1) {
      sqlite3_free(pWal->apWiData[lVar1]);
      pWal->apWiData[lVar1] = (u32 *)0x0;
    }
    if (pWal->exclusiveMode == '\x02') {
      return;
    }
  }
  (*pWal->pDbFd->pMethods->xShmUnmap)(pWal->pDbFd,isDelete);
  return;
}

Assistant:

static void walIndexClose(Wal *pWal, int isDelete){
  if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE || pWal->bShmUnreliable ){
    int i;
    for(i=0; i<pWal->nWiData; i++){
      sqlite3_free((void *)pWal->apWiData[i]);
      pWal->apWiData[i] = 0;
    }
  }
  if( pWal->exclusiveMode!=WAL_HEAPMEMORY_MODE ){
    sqlite3OsShmUnmap(pWal->pDbFd, isDelete);
  }
}